

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int s2pred::TriageCompareSin2Distance<long_double>
              (Vector3<long_double> *x,Vector3<long_double> *y,longdouble r2)

{
  int iVar1;
  longdouble *in_RCX;
  longdouble in_ST0;
  longdouble lVar2;
  undefined8 local_18;
  undefined2 uStack_10;
  undefined6 uStack_e;
  
  if (r2 < (longdouble)2.0) {
    GetSin2Distance((longdouble *)x,y,(Vector3_ld *)&stack0xffffffffffffffe8,in_RCX);
    lVar2 = ((longdouble)1 + r2 * (longdouble)-0.25) * r2;
    in_ST0 = in_ST0 - lVar2;
    lVar2 = (longdouble)CONCAT28(uStack_10,local_18) + lVar2 * (longdouble)1.6263033e-19;
    iVar1 = 1;
    if (in_ST0 <= lVar2) {
      iVar1 = -(uint)(in_ST0 < -lVar2);
    }
    return iVar1;
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&stack0xffffffffffffffe8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
             ,0x1e8,kFatal,(ostream *)&std::cerr);
  std::operator<<((ostream *)CONCAT62(uStack_e,uStack_10),"Check failed: (r2) < (2.0) ");
  abort();
}

Assistant:

int TriageCompareSin2Distance(const Vector3<T>& x, const Vector3<T>& y, T r2) {
  S2_DCHECK_LT(r2, 2.0);  // Only valid for distance limits < 90 degrees.

  constexpr T T_ERR = rounding_epsilon<T>();
  T sin2_xy_error;
  T sin2_xy = GetSin2Distance(x, y, &sin2_xy_error);
  T sin2_r = r2 * (1 - 0.25 * r2);
  T sin2_r_error = 3 * T_ERR * sin2_r;
  T diff = sin2_xy - sin2_r;
  T error = sin2_xy_error + sin2_r_error;
  return (diff > error) ? 1 : (diff < -error) ? -1 : 0;
}